

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadCustomSection(BinaryReader *this,Offset section_size)

{
  string_view x;
  string_view x_00;
  string_view x_01;
  string_view x_02;
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  bool local_157;
  bool local_129;
  string_view local_118;
  char *local_108;
  char *pcStack_100;
  Enum local_ec;
  string_view local_e8;
  char *local_d8;
  char *pcStack_d0;
  Enum local_c0;
  Enum local_bc;
  string_view local_b8;
  char *local_a8;
  char *pcStack_a0;
  undefined4 local_8c;
  Enum local_88;
  string_view local_78;
  char *local_68;
  char *pcStack_60;
  undefined1 local_58 [8];
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_> guard
  ;
  undefined1 auStack_30 [8];
  string_view section_name;
  Offset section_size_local;
  BinaryReader *this_local;
  
  section_name.size_ = section_size;
  string_view::string_view((string_view *)auStack_30);
  RVar2 = ReadStr(this,(string_view *)auStack_30,"section name");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  guard._8_8_ = auStack_30;
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                          (this->delegate_,section_name.size_,auStack_30,section_name.data_);
  bVar1 = Succeeded(RVar2);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    PrintError(this,"BeginCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                     *)local_58,this);
  this->reading_custom_section_ = true;
  local_129 = false;
  if ((this->options_->read_debug_names & 1U) != 0) {
    local_68 = (char *)auStack_30;
    pcStack_60 = section_name.data_;
    string_view::string_view(&local_78,"name");
    x_02.size_ = (size_type)pcStack_60;
    x_02.data_ = local_68;
    local_129 = wabt::operator==(x_02,local_78);
  }
  if (local_129 == false) {
    local_a8 = (char *)auStack_30;
    pcStack_a0 = section_name.data_;
    string_view::string_view(&local_b8,"dylink");
    x_01.size_ = (size_type)pcStack_a0;
    x_01.data_ = local_a8;
    bVar1 = wabt::operator==(x_01,local_b8);
    if (bVar1) {
      local_bc = (Enum)ReadDylinkSection(this,section_name.size_);
      bVar1 = Failed((Result)local_bc);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_01644a43;
      }
    }
    else {
      sVar3 = string_view::rfind((string_view *)auStack_30,"reloc",0);
      if (sVar3 == 0) {
        local_c0 = (Enum)ReadRelocSection(this,section_name.size_);
        bVar1 = Failed((Result)local_c0);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          goto LAB_01644a43;
        }
      }
      else {
        local_d8 = (char *)auStack_30;
        pcStack_d0 = section_name.data_;
        string_view::string_view(&local_e8,"linking");
        x_00.size_ = (size_type)pcStack_d0;
        x_00.data_ = local_d8;
        bVar1 = wabt::operator==(x_00,local_e8);
        if (bVar1) {
          local_ec = (Enum)ReadLinkingSection(this,section_name.size_);
          bVar1 = Failed((Result)local_ec);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            goto LAB_01644a43;
          }
        }
        else {
          bVar1 = Features::exceptions_enabled(&this->options_->features);
          local_157 = false;
          if (bVar1) {
            local_108 = (char *)auStack_30;
            pcStack_100 = section_name.data_;
            string_view::string_view(&local_118,"exception");
            x.size_ = (size_type)pcStack_100;
            x.data_ = local_108;
            local_157 = wabt::operator==(x,local_118);
          }
          if (local_157 == false) {
            (this->state_).offset = this->read_end_;
          }
          else {
            RVar2 = ReadExceptionSection(this,section_name.size_);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_01644a43;
            }
          }
        }
      }
    }
  }
  else {
    local_88 = (Enum)ReadNameSection(this,section_name.size_);
    bVar1 = Failed((Result)local_88);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_01644a43;
    }
    this->did_read_names_section_ = true;
  }
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
  bVar1 = Succeeded(RVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"EndCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
LAB_01644a43:
  local_8c = 1;
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ~ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                      *)local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadCustomSection(Offset section_size) {
  string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.exceptions_enabled() &&
             section_name == WABT_BINARY_SECTION_EXCEPTION) {
    CHECK_RESULT(ReadExceptionSection(section_size));
  } else {
    // This is an unknown custom section, skip it.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}